

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_array_stride_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t index;
  SPIRType basic_type;
  undefined1 local_188 [208];
  uint *local_b8;
  size_t local_b0;
  uint local_a0 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_60;
  
  SPIRType::SPIRType((SPIRType *)local_188,type);
  local_188._40_8_ = 0;
  local_188._96_8_ = 0;
  uVar2 = get_declared_type_size_msl(this,(SPIRType *)local_188,is_packed,row_major);
  iVar1 = (int)(type->array).super_VectorView<unsigned_int>.buffer_size;
  if (iVar1 != 0) {
    if (iVar1 != 1) {
      index = 0;
      do {
        uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type,index);
        uVar2 = uVar2 * (uVar3 + (uVar3 == 0));
        index = index + 1;
      } while (iVar1 - 1U != index);
    }
    local_188._0_8_ = &PTR__SPIRType_0035c188;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_60);
    local_b0 = 0;
    if (local_b8 != local_a0) {
      free(local_b8);
    }
    local_188._160_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_188._152_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_188 + 0xb0)) {
      free((void *)local_188._152_8_);
    }
    local_188._96_8_ = 0;
    if ((undefined1 *)local_188._88_8_ != local_188 + 0x70) {
      free((void *)local_188._88_8_);
    }
    local_188._40_8_ = 0;
    if ((undefined1 *)local_188._32_8_ != local_188 + 0x38) {
      free((void *)local_188._32_8_);
    }
    return uVar2;
  }
  __assert_fail("dimensions > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                ,0x449a,
                "uint32_t spirv_cross::CompilerMSL::get_declared_type_array_stride_msl(const SPIRType &, bool, bool) const"
               );
}

Assistant:

uint32_t CompilerMSL::get_declared_type_array_stride_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	// Array stride in MSL is always size * array_size. sizeof(float3) == 16,
	// unlike GLSL and HLSL where array stride would be 16 and size 12.

	// We could use parent type here and recurse, but that makes creating physical type remappings
	// far more complicated. We'd rather just create the final type, and ignore having to create the entire type
	// hierarchy in order to compute this value, so make a temporary type on the stack.

	auto basic_type = type;
	basic_type.array.clear();
	basic_type.array_size_literal.clear();
	uint32_t value_size = get_declared_type_size_msl(basic_type, is_packed, row_major);

	uint32_t dimensions = uint32_t(type.array.size());
	assert(dimensions > 0);
	dimensions--;

	// Multiply together every dimension, except the last one.
	for (uint32_t dim = 0; dim < dimensions; dim++)
	{
		uint32_t array_size = to_array_size_literal(type, dim);
		value_size *= max<uint32_t>(array_size, 1u);
	}

	return value_size;
}